

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O3

OPJ_BOOL opj_j2k_encode(opj_j2k_t *p_j2k,opj_stream_private_t *p_stream,opj_event_mgr_t *p_manager)

{
  void **ppvVar1;
  OPJ_UINT32 OVar2;
  OPJ_UINT32 OVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  opj_tcd *poVar8;
  opj_tcd_tilecomp_t *poVar9;
  opj_image_comp_t *poVar10;
  OPJ_INT32 OVar11;
  OPJ_BOOL OVar12;
  OPJ_UINT32 p_src_length;
  int iVar13;
  uint uVar14;
  OPJ_BYTE *p_src;
  uint uVar15;
  opj_image_comp_t *in_RCX;
  bool bVar16;
  int iVar17;
  opj_image_t *poVar18;
  OPJ_UINT32 p_tile_index;
  OPJ_INT32 *pOVar19;
  long lVar20;
  long lVar21;
  opj_tcd *poVar22;
  uint uVar23;
  OPJ_UINT32 OVar24;
  OPJ_BYTE *pOVar25;
  int iVar26;
  ulong uVar27;
  uint local_7c;
  
  if (p_j2k == (opj_j2k_t *)0x0) {
    __assert_fail("p_j2k != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jpambrun[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x278e,
                  "OPJ_BOOL opj_j2k_encode(opj_j2k_t *, opj_stream_private_t *, opj_event_mgr_t *)")
    ;
  }
  if (p_stream == (opj_stream_private_t *)0x0) {
    __assert_fail("p_stream != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jpambrun[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x278f,
                  "OPJ_BOOL opj_j2k_encode(opj_j2k_t *, opj_stream_private_t *, opj_event_mgr_t *)")
    ;
  }
  if (p_manager == (opj_event_mgr_t *)0x0) {
    __assert_fail("p_manager != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jpambrun[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x2790,
                  "OPJ_BOOL opj_j2k_encode(opj_j2k_t *, opj_stream_private_t *, opj_event_mgr_t *)")
    ;
  }
  poVar8 = p_j2k->m_tcd;
  OVar24 = (p_j2k->m_cp).tw * (p_j2k->m_cp).th;
  bVar16 = true;
  if (OVar24 == 1) {
    in_RCX = (opj_image_comp_t *)poVar8->image;
    ppvVar1 = (void **)&in_RCX->x0;
    bVar16 = false;
    if ((ulong)*(uint *)ppvVar1 == 0) goto LAB_0010f298;
    in_RCX = *(opj_image_comp_t **)&in_RCX->prec;
    bVar16 = true;
    lVar20 = 0;
    do {
      if (((byte)*(code *)((long)&in_RCX->data + lVar20) & 0xf) != 0) {
        bVar16 = false;
      }
      lVar20 = lVar20 + 0x40;
    } while ((ulong)*(uint *)ppvVar1 << 6 != lVar20);
    bVar16 = !bVar16;
  }
  if (OVar24 == 0) {
    return 1;
  }
LAB_0010f298:
  p_tile_index = 0;
  local_7c = 0;
  pOVar25 = (OPJ_BYTE *)0x0;
  do {
    OVar12 = opj_j2k_pre_write_tile
                       (p_j2k,p_tile_index,(opj_stream_private_t *)p_manager,
                        (opj_event_mgr_t *)in_RCX);
    p_src = pOVar25;
    if (OVar12 == 0) {
LAB_0010f67e:
      OVar12 = 0;
      goto LAB_0010f680;
    }
    poVar22 = p_j2k->m_tcd;
    if (poVar22->image->numcomps != 0) {
      lVar20 = 0;
      uVar27 = 0;
      do {
        poVar9 = poVar8->tcd_image->tiles->comps;
        if (bVar16) {
          OVar12 = opj_alloc_tile_component_data((opj_tcd_tilecomp_t *)((long)&poVar9->x0 + lVar20))
          ;
          if (OVar12 == 0) {
            OVar12 = 0;
            opj_event_msg(p_manager,1,"Error allocating tile component data.");
            goto LAB_0010f680;
          }
          poVar22 = p_j2k->m_tcd;
        }
        else {
          in_RCX = *(opj_image_comp_t **)((long)&poVar8->image->comps->data + lVar20);
          *(opj_image_comp_t **)((long)&poVar9->data + lVar20) = in_RCX;
          *(undefined4 *)((long)&poVar9->ownsData + lVar20) = 0;
        }
        uVar27 = uVar27 + 1;
        lVar20 = lVar20 + 0x40;
      } while (uVar27 < poVar22->image->numcomps);
    }
    p_src_length = opj_tcd_get_encoded_tile_size(poVar22);
    if (bVar16) {
      if ((local_7c < p_src_length) &&
         (p_src = (OPJ_BYTE *)opj_realloc(pOVar25,(ulong)p_src_length), local_7c = p_src_length,
         p_src == (OPJ_BYTE *)0x0)) {
        if (pOVar25 != (OPJ_BYTE *)0x0) {
          opj_free(pOVar25);
        }
        opj_event_msg(p_manager,1,"Not enough memory to encode all tiles\n");
        return 0;
      }
      poVar22 = p_j2k->m_tcd;
      poVar18 = poVar22->image;
      if (poVar18->numcomps != 0) {
        uVar27 = 0;
        pOVar25 = p_src;
        do {
          poVar10 = poVar18->comps;
          OVar2 = poVar10[uVar27].dx;
          iVar26 = ((poVar10[uVar27].prec >> 3) + 1) - (uint)((poVar10[uVar27].prec & 7) == 0);
          if (iVar26 == 3) {
            iVar26 = 4;
          }
          if ((OVar2 == 0) || (OVar3 = poVar10[uVar27].dy, OVar3 == 0)) {
            __assert_fail("b",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/jpambrun[P]openjpeg/src/lib/openjp2/opj_intmath.h"
                          ,0x78,"OPJ_INT32 opj_int_ceildiv(OPJ_INT32, OPJ_INT32)");
          }
          poVar9 = poVar22->tcd_image->tiles->comps;
          iVar4 = poVar9[uVar27].x1;
          iVar5 = poVar9[uVar27].x0;
          iVar6 = poVar9[uVar27].y0;
          iVar7 = poVar9[uVar27].y1;
          iVar17 = iVar4 - iVar5;
          iVar13 = (int)(~poVar18->x0 + OVar2 + poVar18->x1) / (int)OVar2;
          uVar15 = iVar7 - iVar6;
          in_RCX = (opj_image_comp_t *)(ulong)uVar15;
          uVar14 = iVar13 - iVar17;
          pOVar19 = poVar10[uVar27].data +
                    (uint)((iVar6 - (int)((OVar3 - 1) + poVar18->y0) / (int)OVar3) * iVar13 +
                          (iVar5 - (int)(OVar2 + poVar18->x0 + -1) / (int)OVar2));
          if (iVar26 == 1) {
            if (poVar10[uVar27].sgnd == 0) {
              if (iVar7 != iVar6) {
                uVar23 = 0;
                do {
                  iVar26 = iVar17;
                  if (iVar4 != iVar5) {
                    do {
                      *pOVar25 = (OPJ_BYTE)*pOVar19;
                      pOVar25 = pOVar25 + 1;
                      pOVar19 = pOVar19 + 1;
                      iVar26 = iVar26 + -1;
                    } while (iVar26 != 0);
                  }
                  pOVar19 = pOVar19 + uVar14;
                  uVar23 = uVar23 + 1;
                } while (uVar23 != uVar15);
              }
            }
            else if (iVar7 != iVar6) {
              uVar23 = 0;
              do {
                iVar26 = iVar17;
                if (iVar4 != iVar5) {
                  do {
                    *pOVar25 = (OPJ_BYTE)*pOVar19;
                    pOVar25 = pOVar25 + 1;
                    pOVar19 = pOVar19 + 1;
                    iVar26 = iVar26 + -1;
                  } while (iVar26 != 0);
                }
                pOVar19 = pOVar19 + uVar14;
                uVar23 = uVar23 + 1;
              } while (uVar23 != uVar15);
            }
          }
          else if (iVar26 == 2) {
            if (poVar10[uVar27].sgnd == 0) {
              if (iVar7 != iVar6) {
                uVar23 = 0;
                do {
                  iVar26 = iVar17;
                  if (iVar4 != iVar5) {
                    do {
                      OVar11 = *pOVar19;
                      pOVar19 = pOVar19 + 1;
                      *(short *)pOVar25 = (short)OVar11;
                      pOVar25 = pOVar25 + 2;
                      iVar26 = iVar26 + -1;
                    } while (iVar26 != 0);
                  }
                  pOVar19 = pOVar19 + uVar14;
                  uVar23 = uVar23 + 1;
                } while (uVar23 != uVar15);
              }
            }
            else if (iVar7 != iVar6) {
              uVar23 = 0;
              do {
                iVar26 = iVar17;
                if (iVar4 != iVar5) {
                  do {
                    OVar11 = *pOVar19;
                    pOVar19 = pOVar19 + 1;
                    *(short *)pOVar25 = (short)OVar11;
                    pOVar25 = pOVar25 + 2;
                    iVar26 = iVar26 + -1;
                  } while (iVar26 != 0);
                }
                pOVar19 = pOVar19 + uVar14;
                uVar23 = uVar23 + 1;
              } while (uVar23 != uVar15);
            }
          }
          else if ((iVar26 == 4) && (iVar7 != iVar6)) {
            uVar23 = 0;
            do {
              if (iVar4 != iVar5) {
                lVar21 = 0;
                lVar20 = 0;
                do {
                  *(OPJ_INT32 *)(pOVar25 + lVar20 * 4) = pOVar19[lVar20];
                  lVar20 = lVar20 + 1;
                  lVar21 = lVar21 + -4;
                } while (iVar17 != (int)lVar20);
                pOVar25 = pOVar25 + -lVar21;
                pOVar19 = (OPJ_INT32 *)((long)pOVar19 - lVar21);
              }
              pOVar19 = pOVar19 + uVar14;
              uVar23 = uVar23 + 1;
            } while (uVar23 != uVar15);
          }
          uVar27 = uVar27 + 1;
          poVar18 = poVar22->image;
        } while (uVar27 < poVar18->numcomps);
        poVar22 = p_j2k->m_tcd;
      }
      OVar12 = opj_tcd_copy_tile_data(poVar22,p_src,p_src_length);
      if (OVar12 == 0) {
        OVar12 = 0;
        opj_event_msg(p_manager,1,"Size mismatch between tile data and sent data.");
        goto LAB_0010f685;
      }
    }
    OVar12 = opj_j2k_post_write_tile(p_j2k,p_stream,p_manager);
    if (OVar12 == 0) goto LAB_0010f67e;
    p_tile_index = p_tile_index + 1;
    pOVar25 = p_src;
  } while (p_tile_index != OVar24);
  OVar12 = 1;
LAB_0010f680:
  if (p_src != (OPJ_BYTE *)0x0) {
LAB_0010f685:
    opj_free(p_src);
  }
  return OVar12;
}

Assistant:

OPJ_BOOL opj_j2k_encode(opj_j2k_t * p_j2k,
                        opj_stream_private_t *p_stream,
                        opj_event_mgr_t * p_manager )
{
        OPJ_UINT32 i, j;
        OPJ_UINT32 l_nb_tiles;
        OPJ_UINT32 l_max_tile_size = 0, l_current_tile_size;
        OPJ_BYTE * l_current_data = 00;
        OPJ_BOOL l_reuse_data = OPJ_FALSE;
        opj_tcd_t* p_tcd = 00;

        /* preconditions */
        assert(p_j2k != 00);
        assert(p_stream != 00);
        assert(p_manager != 00);
	
        p_tcd = p_j2k->m_tcd;

        l_nb_tiles = p_j2k->m_cp.th * p_j2k->m_cp.tw;
        if (l_nb_tiles == 1) {
                l_reuse_data = OPJ_TRUE;
#ifdef __SSE__
                for (j=0;j<p_j2k->m_tcd->image->numcomps;++j) {
                        opj_image_comp_t * l_img_comp = p_tcd->image->comps + j;
                        if (((size_t)l_img_comp->data & 0xFU) != 0U) { /* tile data shall be aligned on 16 bytes */
												        l_reuse_data = OPJ_FALSE;
                        }
                }
#endif
        }
        for (i=0;i<l_nb_tiles;++i) {
                if (! opj_j2k_pre_write_tile(p_j2k,i,p_stream,p_manager)) {
                        if (l_current_data) {
                                opj_free(l_current_data);
                        }
                        return OPJ_FALSE;
                }

                /* if we only have one tile, then simply set tile component data equal to image component data */
                /* otherwise, allocate the data */
                for (j=0;j<p_j2k->m_tcd->image->numcomps;++j) {
                        opj_tcd_tilecomp_t* l_tilec = p_tcd->tcd_image->tiles->comps + j;
                        if (l_reuse_data) {
												        opj_image_comp_t * l_img_comp = p_tcd->image->comps + j;
												        l_tilec->data  =  l_img_comp->data;
												        l_tilec->ownsData = OPJ_FALSE;
                        } else {
												        if(! opj_alloc_tile_component_data(l_tilec)) {
												                opj_event_msg(p_manager, EVT_ERROR, "Error allocating tile component data." );
												                if (l_current_data) {
												                        opj_free(l_current_data);
												                }
												                return OPJ_FALSE;
												        }
                        }
                }
                l_current_tile_size = opj_tcd_get_encoded_tile_size(p_j2k->m_tcd);
                if (!l_reuse_data) {
                        if (l_current_tile_size > l_max_tile_size) {
												        OPJ_BYTE *l_new_current_data = (OPJ_BYTE *) opj_realloc(l_current_data, l_current_tile_size);
												        if (! l_new_current_data) {
												                if (l_current_data) {
												                        opj_free(l_current_data);
												                }
												                opj_event_msg(p_manager, EVT_ERROR, "Not enough memory to encode all tiles\n");
												                return OPJ_FALSE;
																}
																l_current_data = l_new_current_data;
																l_max_tile_size = l_current_tile_size;
                        }

                        /* copy image data (32 bit) to l_current_data as contiguous, all-component, zero offset buffer */
                        /* 32 bit components @ 8 bit precision get converted to 8 bit */
                        /* 32 bit components @ 16 bit precision get converted to 16 bit */
                        opj_j2k_get_tile_data(p_j2k->m_tcd,l_current_data);

                        /* now copy this data into the tile component */
                        if (! opj_tcd_copy_tile_data(p_j2k->m_tcd,l_current_data,l_current_tile_size)) {
																opj_event_msg(p_manager, EVT_ERROR, "Size mismatch between tile data and sent data." );
																opj_free(l_current_data);
																return OPJ_FALSE;
                        }
                }

                if (! opj_j2k_post_write_tile (p_j2k,p_stream,p_manager)) {
                        if (l_current_data) {
                                opj_free(l_current_data);
                        }
                        return OPJ_FALSE;
                }
        }

        if (l_current_data) {
                opj_free(l_current_data);
        }
        return OPJ_TRUE;
}